

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialog::adjustPosition(QDialog *this,QWidget *w)

{
  QWidget *this_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QPlatformTheme *pQVar9;
  qsizetype qVar10;
  const_reference ppQVar11;
  int *piVar12;
  QWindow *pQVar13;
  unsigned_long_long uVar14;
  long in_RSI;
  long in_FS_OFFSET;
  bool bVar15;
  QWindow *window;
  QWidget *current;
  int i;
  QScreen *scrn;
  QWindow *parentWindow;
  QPlatformTheme *theme;
  QDialogPrivate *d;
  QPoint pp_1;
  QPoint pp;
  int frameh;
  int framew;
  QWidgetList list;
  QRect desk;
  int extrah;
  int extraw;
  QPoint p;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int local_13c;
  QScreen *local_138;
  QWindow *local_130;
  QWidget *local_118;
  int local_b8;
  int local_b4;
  QList<QWidget_*> local_b0;
  undefined1 local_98 [16];
  undefined8 local_88;
  QList<QScreen_*> local_80;
  undefined1 local_68 [16];
  int local_58;
  int local_54;
  undefined1 *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDialog *)0x744f31);
  pQVar9 = QGuiApplicationPrivate::platformTheme();
  if (pQVar9 != (QPlatformTheme *)0x0) {
    (**(code **)(*(long *)pQVar9 + 0x60))(&local_28,pQVar9,0x12);
    bVar1 = ::QVariant::toBool();
    ::QVariant::~QVariant(&local_28);
    if ((bVar1 & 1) != 0) goto LAB_0074592c;
  }
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
  local_54 = 0;
  local_58 = 0;
  local_130 = (QWindow *)0x0;
  if (in_RSI == 0) {
    local_130 = QDialogPrivate::transientParentWindow
                          ((QDialogPrivate *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_118 = (QWidget *)0x0;
  }
  else {
    local_118 = QWidget::window((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  }
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  if (local_118 == (QWidget *)0x0) {
    if (local_130 == (QWindow *)0x0) {
      QGuiApplication::primaryScreen();
      QScreen::virtualSiblings();
      qVar10 = QList<QScreen_*>::size(&local_80);
      QList<QScreen_*>::~QList((QList<QScreen_*> *)0x7450d2);
      if (qVar10 < 2) {
        local_138 = QWidget::screen((QWidget *)
                                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      }
      else {
        local_88 = QCursor::pos();
        local_138 = (QScreen *)QGuiApplication::screenAt((QPoint *)&local_88);
      }
    }
    else {
      local_138 = (QScreen *)QWindow::screen();
    }
  }
  else {
    local_138 = QWidget::screen((QWidget *)
                                CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  }
  if (local_138 != (QScreen *)0x0) {
    local_98 = QScreen::availableGeometry();
    local_68 = local_98;
  }
  local_b0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b0.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_b0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  local_13c = 0;
  while( true ) {
    if ((local_54 == 0) || (bVar15 = false, local_58 == 0)) {
      qVar10 = QList<QWidget_*>::size(&local_b0);
      bVar15 = local_13c < qVar10;
    }
    if (!bVar15) break;
    ppQVar11 = QList<QWidget_*>::at
                         ((QList<QWidget_*> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    this_00 = *ppQVar11;
    bVar15 = QWidget::isVisible((QWidget *)0x745239);
    if (bVar15) {
      QWidget::geometry(this_00);
      iVar2 = QRect::x((QRect *)0x745257);
      local_b4 = QWidget::x((QWidget *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                           );
      local_b4 = iVar2 - local_b4;
      QWidget::geometry(this_00);
      iVar2 = QRect::y((QRect *)0x745292);
      local_b8 = QWidget::y((QWidget *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                           );
      local_b8 = iVar2 - local_b8;
      piVar12 = qMax<int>(&local_54,&local_b4);
      local_54 = *piVar12;
      piVar12 = qMax<int>(&local_58,&local_b8);
      local_58 = *piVar12;
    }
    local_13c = local_13c + 1;
  }
  if ((((local_54 == 0) || (local_58 == 0)) || (9 < local_54)) || (0x27 < local_58)) {
    local_58 = 0x28;
    local_54 = 10;
  }
  if (local_118 == (QWidget *)0x0) {
    if (local_130 == (QWindow *)0x0) {
      QRect::x((QRect *)0x7455df);
      QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      QRect::y((QRect *)0x745611);
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
    }
    else {
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
      QWindow::mapToGlobal((QPoint *)local_130);
      QPoint::x((QPoint *)0x74555e);
      QWindow::width((QWindow *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      QPoint::y((QPoint *)0x745590);
      QWindow::height((QWindow *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
    }
  }
  else {
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    pQVar13 = QWidget::windowHandle
                        ((QWidget *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    bVar15 = false;
    if (pQVar13 != (QWindow *)0x0) {
      QWidget::windowHandle
                ((QWidget *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      QObject::property((char *)&local_48);
      uVar14 = qvariant_cast<unsigned_long_long>
                         ((QVariant *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00))
      ;
      bVar15 = uVar14 != 0;
      ::QVariant::~QVariant(&local_48);
    }
    if (bVar15) {
      QWidget::pos((QWidget *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
    else {
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
      QWidget::mapToGlobal
                ((QWidget *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (QPoint *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
    QPoint::x((QPoint *)0x745484);
    QWidget::width((QWidget *)0x745495);
    QPoint::y((QPoint *)0x7454b6);
    QWidget::height((QWidget *)0x7454c7);
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
  }
  iVar2 = QPoint::x((QPoint *)0x745660);
  iVar3 = QWidget::width((QWidget *)0x745671);
  iVar2 = (iVar2 - iVar3 / 2) - local_54;
  iVar3 = QPoint::y((QPoint *)0x745699);
  QWidget::height((QWidget *)0x7456aa);
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
  iVar4 = QPoint::x((QPoint *)0x7456ed);
  iVar4 = iVar4 + local_54;
  iVar5 = QWidget::width((QWidget *)0x745705);
  iVar5 = iVar4 + iVar5;
  iVar6 = QRect::x((QRect *)0x74571e);
  iVar7 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if (iVar6 + iVar7 < iVar5) {
    QRect::x((QRect *)0x74574c);
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QWidget::width((QWidget *)0x745776);
    QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdfc);
  }
  iVar5 = QPoint::x((QPoint *)0x74579d);
  iVar7 = QRect::x((QRect *)0x7457ae);
  if (iVar5 < iVar7) {
    QRect::x((QRect *)0x7457c5);
    QPoint::setX((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdfc);
  }
  iVar7 = QPoint::y((QPoint *)0x7457e1);
  iVar7 = iVar7 + local_58;
  iVar5 = QWidget::height((QWidget *)0x7457f9);
  iVar7 = iVar7 + iVar5;
  iVar5 = QRect::y((QRect *)0x745812);
  iVar8 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if (iVar5 + iVar8 < iVar7) {
    in_stack_fffffffffffffe04 = QRect::y((QRect *)0x745840);
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QWidget::height((QWidget *)0x74586a);
    QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdfc);
  }
  iVar5 = QPoint::y((QPoint *)0x745891);
  iVar7 = QRect::y((QRect *)0x7458a2);
  if (iVar5 < iVar7) {
    QRect::y((QRect *)0x7458b9);
    QPoint::setY((QPoint *)CONCAT44(in_stack_fffffffffffffe04,iVar5),in_stack_fffffffffffffdfc);
  }
  if (local_138 != (QScreen *)0x0) {
    pQVar13 = QWidget::windowHandle((QWidget *)CONCAT44(in_stack_fffffffffffffe04,iVar5));
    if (pQVar13 != (QWindow *)0x0) {
      QWindow::setScreen((QScreen *)pQVar13);
    }
  }
  QWidget::move((QWidget *)CONCAT44(iVar6,iVar4),(QPoint *)CONCAT44(iVar3,iVar2));
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x74592c);
LAB_0074592c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::adjustPosition(QWidget* w)
{
    Q_D(QDialog);

    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme())
        if (theme->themeHint(QPlatformTheme::WindowAutoPlacement).toBool())
            return;
    QPoint p(0, 0);
    int extraw = 0, extrah = 0;
    const QWindow *parentWindow = nullptr;
    if (w) {
        w = w->window();
    } else {
        parentWindow = d->transientParentWindow();
    }
    QRect desk;
    QScreen *scrn = nullptr;
    if (w)
        scrn = w->screen();
    else if (parentWindow)
        scrn = parentWindow->screen();
    else if (QGuiApplication::primaryScreen()->virtualSiblings().size() > 1)
        scrn = QGuiApplication::screenAt(QCursor::pos());
    else
        scrn = screen();
    if (scrn)
        desk = scrn->availableGeometry();

    QWidgetList list = QApplication::topLevelWidgets();
    for (int i = 0; (extraw == 0 || extrah == 0) && i < list.size(); ++i) {
        QWidget * current = list.at(i);
        if (current->isVisible()) {
            int framew = current->geometry().x() - current->x();
            int frameh = current->geometry().y() - current->y();

            extraw = qMax(extraw, framew);
            extrah = qMax(extrah, frameh);
        }
    }

    // sanity check for decoration frames. With embedding, we
    // might get extraordinary values
    if (extraw == 0 || extrah == 0 || extraw >= 10 || extrah >= 40) {
        extrah = 40;
        extraw = 10;
    }


    if (w) {
        // Use pos() if the widget is embedded into a native window
        QPoint pp;
        if (w->windowHandle() && qvariant_cast<WId>(w->windowHandle()->property("_q_embedded_native_parent_handle")))
            pp = w->pos();
        else
            pp = w->mapToGlobal(QPoint(0,0));
        p = QPoint(pp.x() + w->width()/2,
                    pp.y() + w->height()/ 2);
    } else if (parentWindow) {
        // QTBUG-63406: Widget-based dialog in QML, which has no Widget parent
        // but a transient parent window.
        QPoint pp = parentWindow->mapToGlobal(QPoint(0, 0));
        p = QPoint(pp.x() + parentWindow->width() / 2, pp.y() + parentWindow->height() / 2);
    } else {
        // p = middle of the desktop
        p = QPoint(desk.x() + desk.width()/2, desk.y() + desk.height()/2);
    }

    // p = origin of this
    p = QPoint(p.x()-width()/2 - extraw,
                p.y()-height()/2 - extrah);


    if (p.x() + extraw + width() > desk.x() + desk.width())
        p.setX(desk.x() + desk.width() - width() - extraw);
    if (p.x() < desk.x())
        p.setX(desk.x());

    if (p.y() + extrah + height() > desk.y() + desk.height())
        p.setY(desk.y() + desk.height() - height() - extrah);
    if (p.y() < desk.y())
        p.setY(desk.y());

    // QTBUG-52735: Manually set the correct target screen since scaling in a
    // subsequent call to QWindow::resize() may otherwise use the wrong factor
    // if the screen changed notification is still in an event queue.
    if (scrn) {
        if (QWindow *window = windowHandle())
            window->setScreen(scrn);
    }

    move(p);
}